

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O3

void __thiscall ftxui::ScreenInteractive::Draw(ScreenInteractive *this,Component *component)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  Dimensions DVar7;
  ostream *poVar8;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  uint uVar12;
  long *plVar13;
  pointer pPVar14;
  size_type *psVar15;
  pointer pvVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint __uval;
  uint uVar21;
  int iVar22;
  uint uVar23;
  Cursor CVar24;
  string __str_1;
  string __str;
  Element document;
  string local_b8;
  undefined1 local_98 [24];
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [23];
  allocator_type local_51;
  Element local_50;
  string *local_40;
  string *local_38;
  
  (*((component->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_ComponentBase[2])(&local_50);
  switch(this->dimension_) {
  case FitComponent:
    DVar7 = Terminal::Size();
    (*(local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Node[2])
              ();
    iVar22 = ((local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             requirement_).min_x;
    if (DVar7.dimx <= iVar22) {
      iVar22 = DVar7.dimx;
    }
    iVar3 = ((local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            requirement_).min_y;
    iVar18 = DVar7.dimy;
    if (iVar3 < DVar7.dimy) {
      iVar18 = iVar3;
    }
    break;
  case Fixed:
    iVar22 = (this->super_Screen).dimx_;
    iVar18 = (this->super_Screen).dimy_;
    break;
  case Fullscreen:
    DVar7 = Terminal::Size();
    iVar22 = DVar7.dimx;
    DVar7 = Terminal::Size();
    iVar18 = DVar7.dimy;
    break;
  case TerminalOutput:
    (*(local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Node[2])
              ();
    DVar7 = Terminal::Size();
    iVar22 = DVar7.dimx;
    iVar18 = ((local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             requirement_).min_y;
    break;
  default:
    iVar22 = 0;
    iVar18 = 0;
  }
  bVar5 = (this->super_Screen).dimy_ != iVar18;
  bVar6 = (this->super_Screen).dimx_ != iVar22;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->reset_cursor_position)._M_dataplus._M_p,
                      (this->reset_cursor_position)._M_string_length);
  Screen::ResetPosition_abi_cxx11_(&local_b8,&this->super_Screen,bVar5 || bVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1));
  }
  if (bVar5 || bVar6) {
    (this->super_Screen).dimx_ = iVar22;
    (this->super_Screen).dimy_ = iVar18;
    std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector
              ((vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *)local_98,(long)iVar22,
               &local_51);
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::vector((vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
              *)&local_78,(long)iVar18,(value_type *)local_98,(allocator_type *)(local_68 + 0x16));
    local_b8.field_2._M_allocated_capacity =
         (size_type)
         (this->super_Screen).pixels_.
         super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->super_Screen).pixels_.
    super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_68._0_8_;
    local_b8._M_dataplus._M_p =
         (pointer)(this->super_Screen).pixels_.
                  super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_b8._M_string_length =
         (size_type)
         (this->super_Screen).pixels_.
         super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->super_Screen).pixels_.
    super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78._M_allocated_capacity;
    (this->super_Screen).pixels_.
    super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = (pointer)0x0;
    local_68._0_8_ = (pointer)0x0;
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::~vector((vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
               *)&local_b8);
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::~vector((vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
               *)&local_78);
    std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::~vector
              ((vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *)local_98);
    uVar1 = (this->super_Screen).dimx_;
    uVar2 = (this->super_Screen).dimy_;
    CVar24.x = uVar1 + -1;
    CVar24.y = uVar2 + -1;
    (this->super_Screen).cursor_ = CVar24;
  }
  iVar22 = Draw::i + 1;
  if ((this->use_alternative_screen_ == false) && (Draw::i + (iVar22 / 0x14) * -0x14 == -1)) {
    Draw::i = iVar22;
    local_78._M_allocated_capacity = (size_type)(pointer)local_68;
    std::__cxx11::string::_M_construct((ulong)&local_78,'\x01');
    *(undefined1 *)local_78._M_allocated_capacity = 0x36;
    plVar9 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_78,0,(char *)0x0,(anonymous_namespace)::CSI_abi_cxx11_
                               );
    plVar13 = plVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar13) {
      local_b8.field_2._M_allocated_capacity = *plVar13;
      local_b8.field_2._8_8_ = plVar9[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *plVar13;
      local_b8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_b8._M_string_length = plVar9[1];
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_b8);
    pPVar14 = (pointer)(plVar9 + 2);
    if ((pointer)*plVar9 == pPVar14) {
      local_98._16_8_ = (pPVar14->character)._M_dataplus._M_p;
      lStack_80 = plVar9[3];
      local_98._0_8_ = (pointer)(local_98 + 0x10);
    }
    else {
      local_98._16_8_ = (pPVar14->character)._M_dataplus._M_p;
      local_98._0_8_ = (pointer)*plVar9;
    }
    local_98._8_8_ = plVar9[1];
    *plVar9 = (long)pPVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((pointer)local_78._M_allocated_capacity != (pointer)local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      (ulong)((long)&(((_Vector_impl *)&((string *)local_68._0_8_)->_M_dataplus)->
                                     super__Vector_impl_data)._M_start + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_98._0_8_,local_98._8_8_);
    iVar22 = Draw::i;
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
      iVar22 = Draw::i;
    }
  }
  Draw::i = iVar22;
  ftxui::Render(&this->super_Screen,&local_50);
  local_38 = &this->set_cursor_position;
  std::__cxx11::string::_M_replace
            ((ulong)local_38,0,(char *)(this->set_cursor_position)._M_string_length,0x1585e9);
  local_40 = &this->reset_cursor_position;
  std::__cxx11::string::_M_replace
            ((ulong)local_40,0,(char *)(this->reset_cursor_position)._M_string_length,0x1585e9);
  uVar23 = ~(this->super_Screen).cursor_.y + (this->super_Screen).dimy_;
  uVar21 = ~(this->super_Screen).cursor_.x + (this->super_Screen).dimx_;
  if (uVar21 != 0) {
    uVar20 = -uVar21;
    if (0 < (int)uVar21) {
      uVar20 = uVar21;
    }
    uVar19 = 1;
    if (9 < uVar20) {
      uVar17 = (ulong)uVar20;
      uVar12 = 4;
      do {
        uVar19 = uVar12;
        uVar11 = (uint)uVar17;
        if (uVar11 < 100) {
          uVar19 = uVar19 - 2;
          goto LAB_00145570;
        }
        if (uVar11 < 1000) {
          uVar19 = uVar19 - 1;
          goto LAB_00145570;
        }
        if (uVar11 < 10000) goto LAB_00145570;
        uVar17 = uVar17 / 10000;
        uVar12 = uVar19 + 4;
      } while (99999 < uVar11);
      uVar19 = uVar19 + 1;
    }
LAB_00145570:
    cVar4 = (char)((int)uVar21 >> 0x1f);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar19 - cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((string *)local_98._0_8_)->_M_dataplus)._M_p +
                       (ulong)(uVar21 >> 0x1f)),uVar19,uVar20);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x159a7c);
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_68._0_8_ = *plVar13;
      local_68._8_8_ = plVar9[3];
      local_78._M_allocated_capacity = (size_type)local_68;
    }
    else {
      local_68._0_8_ = *plVar13;
      local_78._M_allocated_capacity = (size_type)(long *)*plVar9;
    }
    local_78._8_8_ = plVar9[1];
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_78._M_local_buf);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_b8.field_2._M_allocated_capacity = *psVar15;
      local_b8.field_2._8_8_ = plVar9[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar15;
      local_b8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_b8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_38,(ulong)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_78._M_allocated_capacity != local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_68._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
    }
    uVar19 = 1;
    if (9 < uVar20) {
      uVar17 = (ulong)uVar20;
      uVar12 = 4;
      do {
        uVar19 = uVar12;
        uVar11 = (uint)uVar17;
        if (uVar11 < 100) {
          uVar19 = uVar19 - 2;
          goto LAB_0014570b;
        }
        if (uVar11 < 1000) {
          uVar19 = uVar19 - 1;
          goto LAB_0014570b;
        }
        if (uVar11 < 10000) goto LAB_0014570b;
        uVar17 = uVar17 / 10000;
        uVar12 = uVar19 + 4;
      } while (99999 < uVar11);
      uVar19 = uVar19 + 1;
    }
LAB_0014570b:
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar19 - cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((string *)local_98._0_8_)->_M_dataplus)._M_p +
                       (ulong)(uVar21 >> 0x1f)),uVar19,uVar20);
    puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x159a7c);
    pvVar16 = (pointer)(puVar10 + 2);
    if ((pointer)*puVar10 == pvVar16) {
      local_68._0_8_ =
           (pvVar16->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_68._8_8_ = puVar10[3];
      local_78._M_allocated_capacity = (size_type)(pointer)local_68;
    }
    else {
      local_68._0_8_ =
           (pvVar16->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_78._M_allocated_capacity = (size_type)(pointer)*puVar10;
    }
    local_78._8_8_ = puVar10[1];
    *puVar10 = pvVar16;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_78._M_local_buf);
    plVar13 = plVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar13) {
      local_b8.field_2._M_allocated_capacity = *plVar13;
      local_b8.field_2._8_8_ = plVar9[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *plVar13;
      local_b8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_b8._M_string_length = plVar9[1];
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_40,(ulong)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((pointer)local_78._M_allocated_capacity != (pointer)local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      (ulong)((long)&(((_Vector_impl *)&((string *)local_68._0_8_)->_M_dataplus)->
                                     super__Vector_impl_data)._M_start + 1));
    }
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
    }
  }
  if (uVar23 != 0) {
    uVar21 = -uVar23;
    if (0 < (int)uVar23) {
      uVar21 = uVar23;
    }
    uVar20 = 1;
    if (9 < uVar21) {
      uVar17 = (ulong)uVar21;
      uVar19 = 4;
      do {
        uVar20 = uVar19;
        uVar12 = (uint)uVar17;
        if (uVar12 < 100) {
          uVar20 = uVar20 - 2;
          goto LAB_001458b0;
        }
        if (uVar12 < 1000) {
          uVar20 = uVar20 - 1;
          goto LAB_001458b0;
        }
        if (uVar12 < 10000) goto LAB_001458b0;
        uVar17 = uVar17 / 10000;
        uVar19 = uVar20 + 4;
      } while (99999 < uVar12);
      uVar20 = uVar20 + 1;
    }
LAB_001458b0:
    cVar4 = (char)((int)uVar23 >> 0x1f);
    pPVar14 = (pointer)(local_98 + 0x10);
    local_98._0_8_ = pPVar14;
    std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar20 - cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((string *)local_98._0_8_)->_M_dataplus)._M_p +
                       (ulong)(uVar23 >> 0x1f)),uVar20,uVar21);
    puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x159a7c);
    pvVar16 = (pointer)(puVar10 + 2);
    if ((pointer)*puVar10 == pvVar16) {
      local_68._0_8_ =
           (pvVar16->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_68._8_8_ = puVar10[3];
      local_78._M_allocated_capacity = (size_type)(pointer)local_68;
    }
    else {
      local_68._0_8_ =
           (pvVar16->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_78._M_allocated_capacity = (size_type)(pointer)*puVar10;
    }
    local_78._8_8_ = puVar10[1];
    *puVar10 = pvVar16;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_78._M_local_buf);
    psVar15 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_b8.field_2._M_allocated_capacity = *psVar15;
      local_b8.field_2._8_8_ = plVar9[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar15;
      local_b8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_b8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_38,(ulong)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_78._M_allocated_capacity != (pointer)local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      (ulong)((long)&(((string *)local_68._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((pointer)local_98._0_8_ != pPVar14) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
    }
    uVar20 = 1;
    if (9 < uVar21) {
      uVar17 = (ulong)uVar21;
      uVar19 = 4;
      do {
        uVar20 = uVar19;
        uVar12 = (uint)uVar17;
        if (uVar12 < 100) {
          uVar20 = uVar20 - 2;
          goto LAB_00145a46;
        }
        if (uVar12 < 1000) {
          uVar20 = uVar20 - 1;
          goto LAB_00145a46;
        }
        if (uVar12 < 10000) goto LAB_00145a46;
        uVar17 = uVar17 / 10000;
        uVar19 = uVar20 + 4;
      } while (99999 < uVar12);
      uVar20 = uVar20 + 1;
    }
LAB_00145a46:
    local_98._0_8_ = pPVar14;
    std::__cxx11::string::_M_construct((ulong)local_98,(char)uVar20 - cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&(((string *)local_98._0_8_)->_M_dataplus)._M_p +
                       (ulong)(uVar23 >> 0x1f)),uVar20,uVar21);
    puVar10 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x159a7c);
    pvVar16 = (pointer)(puVar10 + 2);
    if ((pointer)*puVar10 == pvVar16) {
      local_68._0_8_ =
           (pvVar16->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_68._8_8_ = puVar10[3];
      local_78._M_allocated_capacity = (size_type)(pointer)local_68;
    }
    else {
      local_68._0_8_ =
           (pvVar16->super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_78._M_allocated_capacity = (size_type)(pointer)*puVar10;
    }
    local_78._8_8_ = puVar10[1];
    *puVar10 = pvVar16;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_78._M_local_buf);
    plVar13 = plVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar13) {
      local_b8.field_2._M_allocated_capacity = *plVar13;
      local_b8.field_2._8_8_ = plVar9[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *plVar13;
      local_b8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_b8._M_string_length = plVar9[1];
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_40,(ulong)local_b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((pointer)local_78._M_allocated_capacity != (pointer)local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,
                      (ulong)((long)&(((_Vector_impl *)&((string *)local_68._0_8_)->_M_dataplus)->
                                     super__Vector_impl_data)._M_start + 1));
    }
    if ((pointer)local_98._0_8_ != pPVar14) {
      operator_delete((void *)local_98._0_8_,
                      (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
    }
  }
  if (local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void ScreenInteractive::Draw(Component component) {
  auto document = component->Render();
  int dimx = 0;
  int dimy = 0;
  switch (dimension_) {
    case Dimension::Fixed:
      dimx = dimx_;
      dimy = dimy_;
      break;
    case Dimension::TerminalOutput:
      document->ComputeRequirement();
      dimx = Terminal::Size().dimx;
      dimy = document->requirement().min_y;
      break;
    case Dimension::Fullscreen:
      dimx = Terminal::Size().dimx;
      dimy = Terminal::Size().dimy;
      break;
    case Dimension::FitComponent:
      auto terminal = Terminal::Size();
      document->ComputeRequirement();
      dimx = std::min(document->requirement().min_x, terminal.dimx);
      dimy = std::min(document->requirement().min_y, terminal.dimy);
      break;
  }

  bool resized = (dimx != dimx_) || (dimy != dimy_);
  std::cout << reset_cursor_position << ResetPosition(/*clear=*/resized);

  // Resize the screen if needed.
  if (resized) {
    dimx_ = dimx;
    dimy_ = dimy;
    pixels_ = std::vector<std::vector<Pixel>>(dimy, std::vector<Pixel>(dimx));
    cursor_.x = dimx_ - 1;
    cursor_.y = dimy_ - 1;
  }

  // Periodically request the terminal emulator the frame position relative to
  // the screen. This is useful for converting mouse position reported in
  // screen's coordinates to frame's coordinates.
  static constexpr int cursor_refresh_rate =
#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
      // Microsoft's terminal suffers from a [bug]. When reporting the cursor
      // position, several output sequences are mixed together into garbage.
      // This causes FTXUI user to see some "1;1;R" sequences into the Input
      // component. See [issue]. Solution is to request cursor position less
      // often. [bug]: https://github.com/microsoft/terminal/pull/7583 [issue]:
      // https://github.com/ArthurSonzogni/FTXUI/issues/136
      150;
#else
      20;
#endif
  static int i = -3;
  ++i;
  if (!use_alternative_screen_ && (i % cursor_refresh_rate == 0))
    std::cout << DeviceStatusReport(DSRMode::kCursor);

  Render(*this, document);

  // Set cursor position for user using tools to insert CJK characters.
  set_cursor_position = "";
  reset_cursor_position = "";

  int dx = dimx_ - 1 - cursor_.x;
  int dy = dimy_ - 1 - cursor_.y;

  if (dx != 0) {
    set_cursor_position += "\x1B[" + std::to_string(dx) + "D";
    reset_cursor_position += "\x1B[" + std::to_string(dx) + "C";
  }
  if (dy != 0) {
    set_cursor_position += "\x1B[" + std::to_string(dy) + "A";
    reset_cursor_position += "\x1B[" + std::to_string(dy) + "B";
  }
}